

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void setJoinExpr(Expr *p,int iTable)

{
  if (p != (Expr *)0x0) {
    do {
      *(byte *)&p->flags = (byte)p->flags | 1;
      p->iRightJoinTable = (i16)iTable;
      setJoinExpr(p->pLeft,iTable);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}